

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_writescalar(t_symbol *templatesym,t_word *w,_binbuf *b,int amarrayelement)

{
  _array *p_Var1;
  t_symbol *templatesym_00;
  t_template *ptVar2;
  t_atom *argv;
  ulong uVar3;
  int iVar4;
  long lVar5;
  size_t oldsize;
  t_atom *ptVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  t_word *ptVar10;
  bool bVar11;
  t_atom templatename;
  
  ptVar2 = template_findbyname(templatesym);
  uVar8 = 0;
  argv = (t_atom *)getbytes(0);
  if (ptVar2 != (t_template *)0x0) {
    uVar8 = ptVar2->t_n;
  }
  if (amarrayelement == 0) {
    templatename.a_type = A_SYMBOL;
    templatename.a_w.w_symbol = gensym(templatesym->s_name + 3);
    binbuf_add(b,1,&templatename);
  }
  if (ptVar2 == (t_template *)0x0) {
    bug("canvas_writescalar");
  }
  uVar7 = 0;
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar7;
  }
  iVar4 = 0;
  ptVar10 = w;
  for (; uVar9 * 3 != uVar7; uVar7 = uVar7 + 3) {
    if ((uint)(&ptVar2->t_vec->ds_type)[uVar7 * 2] < 2) {
      lVar5 = (long)iVar4;
      oldsize = lVar5 * 0x10;
      iVar4 = iVar4 + 1;
      argv = (t_atom *)resizebytes(argv,oldsize,oldsize + 0x10);
      ptVar6 = argv + lVar5;
      if ((&ptVar2->t_vec->ds_type)[uVar7 * 2] == 0) {
        ptVar6->a_type = A_FLOAT;
        (ptVar6->a_w).w_float = ptVar10->w_float;
      }
      else {
        ptVar6->a_type = A_SYMBOL;
        ptVar6->a_w = *ptVar10;
      }
    }
    ptVar10 = ptVar10 + 1;
  }
  if (iVar4 == 0 && amarrayelement != 0) {
    argv->a_type = A_SYMBOL;
    (argv->a_w).w_symbol = &s_bang;
    iVar4 = 1;
  }
  binbuf_add(b,iVar4,argv);
  binbuf_addsemi(b);
  freebytes(argv,(long)iVar4 << 4);
  for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    iVar4 = ptVar2->t_vec[uVar7].ds_type;
    if (iVar4 == 2) {
      binbuf_savetext(w[uVar7].w_binbuf,b);
    }
    else if (iVar4 == 3) {
      p_Var1 = w[uVar7].w_array;
      iVar4 = p_Var1->a_elemsize;
      templatesym_00 = ptVar2->t_vec[uVar7].ds_arraytemplate;
      uVar8 = p_Var1->a_n;
      if (p_Var1->a_n < 1) {
        uVar8 = 0;
      }
      uVar3 = (ulong)uVar8;
      lVar5 = 0;
      while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
        canvas_writescalar(templatesym_00,(t_word *)(p_Var1->a_vec + lVar5),b,1);
        lVar5 = lVar5 + iVar4;
      }
      binbuf_addsemi(b);
    }
  }
  return;
}

Assistant:

void canvas_writescalar(t_symbol *templatesym, t_word *w, t_binbuf *b,
    int amarrayelement)
{
    t_template *template = template_findbyname(templatesym);
    t_atom *a = (t_atom *)t_getbytes(0);
    int i, n = template?(template->t_n):0, natom = 0;
    if (!amarrayelement)
    {
        t_atom templatename;
        SETSYMBOL(&templatename, gensym(templatesym->s_name + 3));
        binbuf_add(b, 1, &templatename);
    }
    if (!template)
        bug("canvas_writescalar");
        /* write the atoms (floats and symbols) */
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_FLOAT ||
            template->t_vec[i].ds_type == DT_SYMBOL)
        {
            a = (t_atom *)t_resizebytes(a,
                natom * sizeof(*a), (natom + 1) * sizeof (*a));
            if (template->t_vec[i].ds_type == DT_FLOAT)
                SETFLOAT(a + natom, w[i].w_float);
            else SETSYMBOL(a + natom,  w[i].w_symbol);
            natom++;
        }
    }
        /* array elements have to have at least something */
    if (natom == 0 && amarrayelement)
        SETSYMBOL(a + natom,  &s_bang), natom++;
    binbuf_add(b, natom, a);
    binbuf_addsemi(b);
    t_freebytes(a, natom * sizeof(*a));
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            int j;
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = a->a_n;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            for (j = 0; j < nitems; j++)
                canvas_writescalar(arraytemplatesym,
                    (t_word *)(((char *)a->a_vec) + elemsize * j), b, 1);
            binbuf_addsemi(b);
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
            binbuf_savetext(w[i].w_binbuf, b);
    }
}